

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

JavascriptString * Js::JavascriptString::ToCaseCore<false,false>(JavascriptString *pThis)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  charcount_t lhs;
  charcount_t cVar5;
  ScriptContext *scriptContext;
  Recycler *pRVar6;
  char16_t *destString;
  undefined4 extraout_var;
  undefined4 *puVar7;
  JavascriptString *pJVar8;
  undefined4 extraout_var_00;
  undefined1 local_60 [8];
  TrackAllocData data;
  ApiError error;
  
  if (pThis->m_charLength == 0) {
    return pThis;
  }
  scriptContext = Js::Type::GetScriptContext((pThis->super_RecyclableObject).type.ptr);
  data._36_4_ = 0;
  uVar3 = UInt32Math::Add(pThis->m_charLength,1);
  local_60 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_7ec8d8c;
  data.filename._0_4_ = 0x948;
  data.plusSize = (ulong)uVar3;
  pRVar6 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  destString = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                         ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)uVar3);
  iVar4 = (*(pThis->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pThis);
  lhs = PlatformAgnostic::UnicodeText::ChangeStringLinguisticCase<false,false>
                  ((char16 *)CONCAT44(extraout_var,iVar4),pThis->m_charLength,destString,uVar3,
                   (ApiError *)&data.field_0x24);
  if (data._36_4_ == 4) {
    Throw::OutOfMemory();
  }
  if (0x7ffffffd < lhs - 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x956,
                                "(requiredStringLength > 0 && IsValidCharCount(requiredStringLength))"
                                ,
                                "requiredStringLength > 0 && IsValidCharCount(requiredStringLength)"
                               );
    if (!bVar2) goto LAB_00bc69f9;
    *puVar7 = 0;
  }
  if (data._36_4_ != 3) {
    if (data._36_4_ == 0) {
      if (lhs == 1) {
        pJVar8 = CharStringCache::GetStringForChar
                           (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                             charStringCache,*destString);
        return pJVar8;
      }
      goto LAB_00bc69dc;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x966,"(error == ApiError::InsufficientBuffer)",
                                "error == ApiError::InsufficientBuffer");
    if (!bVar2) goto LAB_00bc69f9;
    *puVar7 = 0;
  }
  if (lhs < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x974,"(requiredStringLength > 1)","requiredStringLength > 1");
    if (!bVar2) goto LAB_00bc69f9;
    *puVar7 = 0;
  }
  uVar3 = UInt32Math::Add(lhs,1);
  local_60 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_7ec8d8c;
  data.filename._0_4_ = 0x977;
  data.plusSize = (ulong)uVar3;
  pRVar6 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  destString = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                         ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)uVar3);
  iVar4 = (*(pThis->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pThis);
  cVar5 = PlatformAgnostic::UnicodeText::ChangeStringLinguisticCase<false,false>
                    ((char16 *)CONCAT44(extraout_var_00,iVar4),pThis->m_charLength,destString,uVar3,
                     (ApiError *)&data.field_0x24);
  if ((cVar5 != lhs) || (lhs = cVar5, data._36_4_ != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x979,
                                "(actualStringLength == requiredStringLength && error == ApiError::NoError)"
                                ,
                                "actualStringLength == requiredStringLength && error == ApiError::NoError"
                               );
    if (!bVar2) {
LAB_00bc69f9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
    lhs = cVar5;
  }
LAB_00bc69dc:
  pJVar8 = NewWithBufferT<Js::LiteralString,false>(destString,lhs,scriptContext);
  return pJVar8;
}

Assistant:

JavascriptString* JavascriptString::ToCaseCore(JavascriptString* pThis)
    {
        using namespace PlatformAgnostic::UnicodeText;
        if (pThis->GetLength() == 0)
        {
            return pThis;
        }

        ScriptContext* scriptContext = pThis->type->GetScriptContext();
        ApiError error = ApiError::NoError;
        charcount_t pThisLength = pThis->GetLength();

        if (useInvariant)
        {
            const char16 *pThisString = pThis->GetString();
            bool isAscii = true;
            for (charcount_t i = 0; i < pThisLength; i++)
            {
                if (pThisString[i] >= 0x80)
                {
                    isAscii = false;
                    break;
                }
            }

            if (isAscii)
            {
                char16 *ret = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, UInt32Math::Add(pThisLength, 1));
                const char16 diffBetweenCases = 32;
                for (charcount_t i = 0; i < pThisLength; i++)
                {
                    char16 cur = pThisString[i];
                    if (toUpper)
                    {
                        if (cur >= _u('a') && cur <= _u('z'))
                        {
                            ret[i] = cur - diffBetweenCases;
                        }
                        else
                        {
                            ret[i] = cur;
                        }
                    }
                    else
                    {
                        if (cur >= _u('A') && cur <= _u('Z'))
                        {
                            ret[i] = cur + diffBetweenCases;
                        }
                        else
                        {
                            ret[i] = cur;
                        }
                    }
                }

                ret[pThisLength] = 0;

                return JavascriptString::NewWithBuffer(ret, pThisLength, scriptContext);
            }
        }

        // pre-flight to get the length required, as it may be longer than the original string
        // ICU and Win32(/POSIX) implementations of these functions differ slightly in how to get the required number of characters.
        // For Win32 (LCMapStringEx), you must provide nullptr/0, as providing a buffer that is too small will cause an error and will *not*
        // report the number of characters required. For ICU, however, you can provide a buffer that is too short, and it will still return
        // the length it actually needs.
        //
        // This is a small performance optimization because to(Upper|Lower)Case is can show up hot in certain scenarios.
        // ICU still allows nullptr/0 to be passed to get the string length, and more conservative callers of ChangeStringLinguisticCase should do just that.
        // TODO(jahorto): A truly PlatformAgnostic API wouldn't require cases like this. Once PlatformAgnostic is allowed to use
        // Chakra's memory subsystems, this API should be converted to one that only takes a source string and returns a Recycler-allocated
        // string in the correct case, performed using whatever operation is the fastest available on that platform.
#ifdef INTL_ICU
        charcount_t guessBufferLength = UInt32Math::Add(pThisLength, 1);
        char16 *guessBuffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, guessBufferLength);
#else
        charcount_t guessBufferLength = 0;
        char16 *guessBuffer = nullptr;
#endif

        charcount_t requiredStringLength = ChangeStringLinguisticCase<toUpper, useInvariant>(pThis->GetSz(), pThis->GetLength(), guessBuffer, guessBufferLength, &error);
        if (error == ApiError::OutOfMemory)
        {
            Throw::OutOfMemory();
        }

        // We exit ToCaseCore early if the source string is 0-length, and casing a non-zero length string should
        // never result in a zero-length string.
        AssertOrFailFast(requiredStringLength > 0 && IsValidCharCount(requiredStringLength));

#ifdef INTL_ICU
        if (error == ApiError::NoError)
        {
            if (requiredStringLength == 1)
            {
                // don't create a new string in case we may have cached this string earlier
                return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(guessBuffer[0]);
            }
            else
            {
                // use requiredStringLength instead of guessBufferLength because the string can get shorter
                return JavascriptString::NewWithBuffer(guessBuffer, requiredStringLength, scriptContext);
            }
        }
        AssertOrFailFast(error == ApiError::InsufficientBuffer);
#else
        AssertOrFailFast(error == ApiError::NoError);
        if (requiredStringLength == 1)
        {
            // this one-char string special case is only for non-ICU because there should never be a case where the error
            // was InsufficientBufer but the required length was 1
            char16 buffer[2] = { pThis->GetSz()[0], 0 };
            charcount_t actualStringLength = ChangeStringLinguisticCase<toUpper, useInvariant>(pThis->GetSz(), pThis->GetLength(), buffer, 2, &error);
            AssertOrFailFast(actualStringLength == 1 && error == ApiError::NoError);
            return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(buffer[0]);
        }
#endif

        AssertOrFailFast(requiredStringLength > 1);

        charcount_t bufferLength = UInt32Math::Add(requiredStringLength, 1);
        char16* buffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, bufferLength);
        charcount_t actualStringLength = ChangeStringLinguisticCase<toUpper, useInvariant>(pThis->GetSz(), pThis->GetLength(), buffer, bufferLength, &error);
        AssertOrFailFast(actualStringLength == requiredStringLength && error == ApiError::NoError);
        return JavascriptString::NewWithBuffer(buffer, actualStringLength, scriptContext);
    }